

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O3

uint64 __thiscall
libebml::EbmlUnicodeString::UpdateSize(EbmlUnicodeString *this,bool bWithDefault,bool param_2)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,bWithDefault) == 0) {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[0xf])(this);
    if ((char)iVar2 != '\0') {
      return 0;
    }
  }
  (this->super_EbmlElement).Size = (this->Value).UTF8string._M_string_length;
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  uVar1 = (this->super_EbmlElement).DefaultSize;
  if (CONCAT44(extraout_var,iVar2) < uVar1) {
    (this->super_EbmlElement).Size = uVar1;
  }
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_00,iVar2);
}

Assistant:

uint64 EbmlUnicodeString::UpdateSize(bool bWithDefault, bool /* bForceRender */)
{
  if (!bWithDefault && IsDefaultValue())
    return 0;

  SetSize_(Value.GetUTF8().length());
  if (GetSize() < GetDefaultSize())
    SetSize_(GetDefaultSize());

  return GetSize();
}